

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qframe.cpp
# Opt level: O3

void QFrame::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QRect *pQVar1;
  short sVar2;
  uint uVar3;
  QFramePrivate *this;
  QRect QVar4;
  
  if (_c != WriteProperty) {
    if (_c != ReadProperty) {
      return;
    }
    if ((uint)_id < 6) {
      pQVar1 = (QRect *)*_a;
      switch(_id) {
      case 0:
        uVar3 = *(uint *)(*(long *)(_o + 8) + 0x264) & 0xf;
        break;
      case 1:
        (pQVar1->x1).m_i = *(uint *)(*(long *)(_o + 8) + 0x264) & 0xf0;
        return;
      case 2:
        uVar3 = (uint)*(short *)(*(long *)(_o + 8) + 0x268);
        break;
      case 3:
        uVar3 = (uint)*(short *)(*(long *)(_o + 8) + 0x26a);
        break;
      case 4:
        uVar3 = (uint)*(short *)(*(long *)(_o + 8) + 0x26c);
        break;
      case 5:
        QVar4 = frameRect((QFrame *)_o);
        *pQVar1 = QVar4;
        return;
      }
      (pQVar1->x1).m_i = uVar3;
      return;
    }
    return;
  }
  if (5 < (uint)_id) {
    return;
  }
  pQVar1 = (QRect *)*_a;
  switch(_id) {
  case 0:
    uVar3 = *(uint *)(*(long *)(_o + 8) + 0x264) & 0xf0;
    break;
  case 1:
    uVar3 = *(uint *)(*(long *)(_o + 8) + 0x264) & 0xf;
    break;
  case 2:
    this = *(QFramePrivate **)(_o + 8);
    sVar2 = (short)(pQVar1->x1).m_i;
    if (sVar2 == this->lineWidth) {
      return;
    }
    this->lineWidth = sVar2;
    goto LAB_0038fb79;
  case 3:
    this = *(QFramePrivate **)(_o + 8);
    sVar2 = (short)(pQVar1->x1).m_i;
    if (sVar2 == this->midLineWidth) {
      return;
    }
    this->midLineWidth = sVar2;
LAB_0038fb79:
    QFramePrivate::updateFrameWidth(this);
    return;
  case 4:
    return;
  case 5:
    setFrameRect((QFrame *)_o,pQVar1);
    return;
  }
  setFrameStyle((QFrame *)_o,uVar3 | (pQVar1->x1).m_i);
  return;
}

Assistant:

void QFrame::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFrame *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<Shape*>(_v) = _t->frameShape(); break;
        case 1: *reinterpret_cast<Shadow*>(_v) = _t->frameShadow(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->lineWidth(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->midLineWidth(); break;
        case 4: *reinterpret_cast<int*>(_v) = _t->frameWidth(); break;
        case 5: *reinterpret_cast<QRect*>(_v) = _t->frameRect(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setFrameShape(*reinterpret_cast<Shape*>(_v)); break;
        case 1: _t->setFrameShadow(*reinterpret_cast<Shadow*>(_v)); break;
        case 2: _t->setLineWidth(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setMidLineWidth(*reinterpret_cast<int*>(_v)); break;
        case 5: _t->setFrameRect(*reinterpret_cast<QRect*>(_v)); break;
        default: break;
        }
    }
}